

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Index.cpp
# Opt level: O0

void __thiscall
ASDCP::MXF::IndexTableSegment::IndexTableSegment(IndexTableSegment *this,Dictionary *d)

{
  byte_t *value;
  UL local_48;
  Dictionary *local_18;
  Dictionary *d_local;
  IndexTableSegment *this_local;
  
  local_18 = d;
  d_local = (Dictionary *)this;
  InterchangeObject::InterchangeObject(&this->super_InterchangeObject,d);
  (this->super_InterchangeObject).super_KLVPacket._vptr_KLVPacket =
       (_func_int **)&PTR__IndexTableSegment_003398a0;
  this->RtFileOffset = 0;
  this->RtEntryOffset = 0;
  Rational::Rational(&this->IndexEditRate);
  this->IndexStartPosition = 0;
  this->IndexDuration = 0;
  this->EditUnitByteCount = 0;
  this->IndexSID = 0x81;
  this->BodySID = 1;
  this->SliceCount = '\0';
  this->PosTableCount = '\0';
  Array<ASDCP::MXF::IndexTableSegment::DeltaEntry>::Array(&this->DeltaEntryArray);
  Array<ASDCP::MXF::IndexTableSegment::IndexEntry>::Array(&this->IndexEntryArray);
  if ((this->super_InterchangeObject).m_Dict != (Dictionary *)0x0) {
    value = Dictionary::ul((this->super_InterchangeObject).m_Dict,MDD_IndexTableSegment);
    UL::UL(&local_48,value);
    UL::operator=(&(this->super_InterchangeObject).super_KLVPacket.m_UL,&local_48);
    UL::~UL(&local_48);
    return;
  }
  __assert_fail("m_Dict",
                "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/Index.cpp"
                ,0x2c,"ASDCP::MXF::IndexTableSegment::IndexTableSegment(const Dictionary *)");
}

Assistant:

ASDCP::MXF::IndexTableSegment::IndexTableSegment(const Dictionary* d) :
  InterchangeObject(d), RtFileOffset(0), RtEntryOffset(0),
  IndexStartPosition(0), IndexDuration(0), EditUnitByteCount(0),
  IndexSID(129), BodySID(1), SliceCount(0), PosTableCount(0)
{
  assert(m_Dict);
  m_UL = m_Dict->ul(MDD_IndexTableSegment);
}